

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_bucket_realloc(map m)

{
  ulong uVar1;
  size_t sVar2;
  bucket pbVar3;
  long lVar4;
  ulong *in_RDI;
  float fVar5;
  float fVar6;
  bucket b;
  size_t iterator;
  float ratio;
  size_t prime;
  map_type new_map;
  float fVar7;
  map_cb_iterate_args args;
  float fVar8;
  map in_stack_ffffffffffffffa0;
  ulong local_58;
  size_t local_48;
  int local_4;
  
  uVar1 = in_RDI[2];
  args = (map_cb_iterate_args)in_RDI[1];
  fVar5 = (float)(long)*in_RDI;
  fVar8 = (float)*in_RDI;
  fVar6 = (float)(long)args;
  fVar7 = (float)args;
  if ((uVar1 == 0) || (0.1 < fVar8 / fVar7)) {
    if (fVar8 / fVar7 < 0.77) {
      return 0;
    }
    local_48 = uVar1 + 1;
  }
  else {
    local_48 = uVar1 - 1;
  }
  sVar2 = bucket_capacity(local_48);
  pbVar3 = bucket_create(CONCAT44(fVar7,fVar6));
  if (pbVar3 == (bucket)0x0) {
    local_4 = 1;
  }
  else {
    map_iterate(in_stack_ffffffffffffffa0,(map_cb_iterate)CONCAT44(fVar8,fVar5),args);
    for (local_58 = 0; local_58 < in_RDI[1]; local_58 = local_58 + 1) {
      lVar4 = in_RDI[3] + local_58 * 0x18;
      if (*(long *)(lVar4 + 0x10) != 0) {
        free(*(void **)(lVar4 + 0x10));
      }
    }
    free((void *)in_RDI[3]);
    in_RDI[1] = sVar2;
    in_RDI[2] = local_48;
    in_RDI[3] = (ulong)pbVar3;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int map_bucket_realloc(map m)
{
	struct map_type new_map;
	size_t prime = m->prime;
	float ratio = (float)((float)m->count / (float)m->capacity);

	if (prime > 0 && ratio <= MAP_BUCKET_RATIO_MIN)
	{
		--prime;
	}
	else if (ratio >= MAP_BUCKET_RATIO_MAX)
	{
		++prime;
	}
	else
	{
		return 0;
	}

	new_map.hash_cb = m->hash_cb;
	new_map.compare_cb = m->compare_cb;
	new_map.count = 0;
	new_map.prime = prime;
	new_map.capacity = bucket_capacity(prime);
	new_map.buckets = bucket_create(new_map.capacity);

	if (new_map.buckets != NULL)
	{
		size_t iterator;

		map_iterate(m, &map_bucket_realloc_iterator, &new_map);

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);

		m->capacity = new_map.capacity;
		m->prime = new_map.prime;
		m->buckets = new_map.buckets;

		return 0;
	}

	return 1;
}